

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::SubGridIntersector1Moeller<4,_true>_>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined8 uVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  ushort uVar6;
  ushort uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  RTCRayQueryContext *pRVar12;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  byte bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined4 uVar32;
  RTCFilterFunctionN p_Var33;
  byte bVar34;
  undefined4 uVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  ulong unaff_RBP;
  size_t mask;
  long lVar39;
  ulong uVar40;
  int iVar41;
  ulong uVar42;
  long lVar43;
  NodeRef *pNVar44;
  RTCIntersectArguments *pRVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  size_t sVar50;
  ulong uVar51;
  long lVar52;
  RTCIntersectArguments *pRVar53;
  ulong uVar54;
  ulong uVar55;
  bool bVar56;
  bool bVar57;
  int iVar58;
  int iVar59;
  float fVar60;
  uint uVar61;
  float fVar66;
  float fVar68;
  float fVar69;
  vint4 ai;
  undefined1 auVar62 [16];
  uint uVar67;
  uint uVar70;
  float fVar71;
  uint uVar72;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  byte bVar73;
  float fVar74;
  byte bVar80;
  byte bVar81;
  byte bVar83;
  float fVar84;
  byte bVar88;
  byte bVar89;
  float fVar90;
  vint4 ai_1;
  uint uVar75;
  byte bVar82;
  uint uVar85;
  uint uVar91;
  float fVar93;
  uint uVar94;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar86;
  float fVar87;
  float fVar92;
  float fVar95;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uint uVar96;
  float fVar97;
  uint uVar104;
  uint uVar106;
  vint4 ai_2;
  undefined1 auVar98 [16];
  uint uVar108;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar107;
  float fVar109;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar110;
  uint uVar111;
  float fVar112;
  uint uVar113;
  float fVar114;
  uint uVar115;
  float fVar116;
  vint4 ai_3;
  float fVar117;
  uint uVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar126;
  float fVar127;
  vint4 bi_2;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar131;
  vint4 bi_3;
  undefined1 auVar129 [16];
  float fVar132;
  undefined1 auVar130 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  int local_b4c;
  undefined8 local_b48;
  float fStack_b40;
  float fStack_b3c;
  Ray *local_b30;
  RayQueryContext *local_b28;
  ulong local_b20;
  undefined8 local_b18;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  uint local_a98;
  uint uStack_a94;
  uint uStack_a90;
  uint uStack_a8c;
  MoellerTrumboreHitM<4,_embree::sse42::UVIdentity<4>_> hit;
  float fStack_820;
  float fStack_81c;
  NodeRef stack [244];
  
  uVar31 = mm_lookupmask_ps._248_8_;
  uVar30 = mm_lookupmask_ps._240_8_;
  local_b28 = context;
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar3 = ray->tfar, 0.0 <= fVar3)) {
    pNVar44 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar27 = (ray->org).field_0.m128[0];
    fVar28 = (ray->org).field_0.m128[1];
    fVar29 = (ray->org).field_0.m128[2];
    aVar5 = (ray->dir).field_0.field_1;
    fVar157 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar152 = 0.0;
    if (0.0 <= fVar157) {
      fVar152 = fVar157;
    }
    auVar62._4_4_ = -(uint)(ABS(aVar5.y) < DAT_01ff1d40._4_4_);
    auVar62._0_4_ = -(uint)(ABS(aVar5.x) < (float)DAT_01ff1d40);
    auVar62._8_4_ = -(uint)(ABS(aVar5.z) < DAT_01ff1d40._8_4_);
    auVar62._12_4_ = -(uint)(ABS(aVar5.field_3.w) < DAT_01ff1d40._12_4_);
    auVar98 = blendvps((undefined1  [16])aVar5,_DAT_01ff1d40,auVar62);
    auVar62 = rcpps(auVar62,auVar98);
    fVar157 = auVar62._0_4_;
    fVar158 = auVar62._4_4_;
    fVar160 = auVar62._8_4_;
    fVar157 = (1.0 - auVar98._0_4_ * fVar157) * fVar157 + fVar157;
    fVar158 = (1.0 - auVar98._4_4_ * fVar158) * fVar158 + fVar158;
    fVar160 = (1.0 - auVar98._8_4_ * fVar160) * fVar160 + fVar160;
    uVar46 = (ulong)(fVar157 < 0.0) * 0x10;
    uVar47 = (ulong)(fVar158 < 0.0) << 4 | 0x20;
    uVar48 = (ulong)(fVar160 < 0.0) << 4 | 0x40;
    uVar38 = uVar46 ^ 0x10;
    iVar41 = 0x224ff80;
    local_b30 = ray;
    do {
      if (pNVar44 == stack) {
        return;
      }
      sVar50 = pNVar44[-1].ptr;
      pNVar44 = pNVar44 + -1;
      do {
        if ((sVar50 & 8) == 0) {
          pfVar2 = (float *)(sVar50 + 0x20 + uVar46);
          fVar60 = (*pfVar2 - fVar27) * fVar157;
          fVar66 = (pfVar2[1] - fVar27) * fVar157;
          fVar69 = (pfVar2[2] - fVar27) * fVar157;
          fVar71 = (pfVar2[3] - fVar27) * fVar157;
          pfVar2 = (float *)(sVar50 + 0x20 + uVar47);
          fVar74 = (*pfVar2 - fVar28) * fVar158;
          fVar84 = (pfVar2[1] - fVar28) * fVar158;
          fVar90 = (pfVar2[2] - fVar28) * fVar158;
          fVar93 = (pfVar2[3] - fVar28) * fVar158;
          uVar75 = (uint)((int)fVar74 < (int)fVar60) * (int)fVar60 |
                   (uint)((int)fVar74 >= (int)fVar60) * (int)fVar74;
          uVar85 = (uint)((int)fVar84 < (int)fVar66) * (int)fVar66 |
                   (uint)((int)fVar84 >= (int)fVar66) * (int)fVar84;
          uVar91 = (uint)((int)fVar90 < (int)fVar69) * (int)fVar69 |
                   (uint)((int)fVar90 >= (int)fVar69) * (int)fVar90;
          uVar94 = (uint)((int)fVar93 < (int)fVar71) * (int)fVar71 |
                   (uint)((int)fVar93 >= (int)fVar71) * (int)fVar93;
          pfVar2 = (float *)(sVar50 + 0x20 + uVar48);
          fVar60 = (*pfVar2 - fVar29) * fVar160;
          fVar66 = (pfVar2[1] - fVar29) * fVar160;
          fVar69 = (pfVar2[2] - fVar29) * fVar160;
          fVar71 = (pfVar2[3] - fVar29) * fVar160;
          pfVar2 = (float *)(sVar50 + 0x20 + uVar38);
          fVar74 = (*pfVar2 - fVar27) * fVar157;
          fVar84 = (pfVar2[1] - fVar27) * fVar157;
          fVar90 = (pfVar2[2] - fVar27) * fVar157;
          fVar93 = (pfVar2[3] - fVar27) * fVar157;
          pfVar2 = (float *)(sVar50 + 0x20 + (uVar47 ^ 0x10));
          fVar110 = (*pfVar2 - fVar28) * fVar158;
          fVar112 = (pfVar2[1] - fVar28) * fVar158;
          fVar114 = (pfVar2[2] - fVar28) * fVar158;
          fVar117 = (pfVar2[3] - fVar28) * fVar158;
          uVar111 = (uint)((int)fVar74 < (int)fVar110) * (int)fVar74 |
                    (uint)((int)fVar74 >= (int)fVar110) * (int)fVar110;
          uVar113 = (uint)((int)fVar84 < (int)fVar112) * (int)fVar84 |
                    (uint)((int)fVar84 >= (int)fVar112) * (int)fVar112;
          uVar115 = (uint)((int)fVar90 < (int)fVar114) * (int)fVar90 |
                    (uint)((int)fVar90 >= (int)fVar114) * (int)fVar114;
          uVar118 = (uint)((int)fVar93 < (int)fVar117) * (int)fVar93 |
                    (uint)((int)fVar93 >= (int)fVar117) * (int)fVar117;
          pfVar2 = (float *)(sVar50 + 0x20 + (uVar48 ^ 0x10));
          fVar74 = (*pfVar2 - fVar29) * fVar160;
          fVar84 = (pfVar2[1] - fVar29) * fVar160;
          fVar90 = (pfVar2[2] - fVar29) * fVar160;
          fVar93 = (pfVar2[3] - fVar29) * fVar160;
          uVar61 = (uint)((int)fVar60 < (int)fVar152) * (int)fVar152 |
                   (uint)((int)fVar60 >= (int)fVar152) * (int)fVar60;
          uVar67 = (uint)((int)fVar66 < (int)fVar152) * (int)fVar152 |
                   (uint)((int)fVar66 >= (int)fVar152) * (int)fVar66;
          uVar70 = (uint)((int)fVar69 < (int)fVar152) * (int)fVar152 |
                   (uint)((int)fVar69 >= (int)fVar152) * (int)fVar69;
          uVar72 = (uint)((int)fVar71 < (int)fVar152) * (int)fVar152 |
                   (uint)((int)fVar71 >= (int)fVar152) * (int)fVar71;
          uVar96 = (uint)((int)fVar3 < (int)fVar74) * (int)fVar3 |
                   (uint)((int)fVar3 >= (int)fVar74) * (int)fVar74;
          uVar104 = (uint)((int)fVar3 < (int)fVar84) * (int)fVar3 |
                    (uint)((int)fVar3 >= (int)fVar84) * (int)fVar84;
          uVar106 = (uint)((int)fVar3 < (int)fVar90) * (int)fVar3 |
                    (uint)((int)fVar3 >= (int)fVar90) * (int)fVar90;
          uVar108 = (uint)((int)fVar3 < (int)fVar93) * (int)fVar3 |
                    (uint)((int)fVar3 >= (int)fVar93) * (int)fVar93;
          auVar98._0_4_ =
               -(uint)((int)(((int)uVar111 < (int)uVar96) * uVar111 |
                            ((int)uVar111 >= (int)uVar96) * uVar96) <
                      (int)(((int)uVar61 < (int)uVar75) * uVar75 |
                           ((int)uVar61 >= (int)uVar75) * uVar61));
          auVar98._4_4_ =
               -(uint)((int)(((int)uVar113 < (int)uVar104) * uVar113 |
                            ((int)uVar113 >= (int)uVar104) * uVar104) <
                      (int)(((int)uVar67 < (int)uVar85) * uVar85 |
                           ((int)uVar67 >= (int)uVar85) * uVar67));
          auVar98._8_4_ =
               -(uint)((int)(((int)uVar115 < (int)uVar106) * uVar115 |
                            ((int)uVar115 >= (int)uVar106) * uVar106) <
                      (int)(((int)uVar70 < (int)uVar91) * uVar91 |
                           ((int)uVar70 >= (int)uVar91) * uVar70));
          auVar98._12_4_ =
               -(uint)((int)(((int)uVar118 < (int)uVar108) * uVar118 |
                            ((int)uVar118 >= (int)uVar108) * uVar108) <
                      (int)(((int)uVar72 < (int)uVar94) * uVar94 |
                           ((int)uVar72 >= (int)uVar94) * uVar72));
          uVar61 = movmskps(iVar41,auVar98);
          unaff_RBP = ((ulong)uVar61 ^ 0xf) & 0xff;
        }
        if ((sVar50 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar41 = 4;
          }
          else {
            uVar49 = sVar50 & 0xfffffffffffffff0;
            lVar37 = 0;
            if (unaff_RBP != 0) {
              for (; (unaff_RBP >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            iVar41 = 0;
            sVar50 = *(size_t *)(uVar49 + lVar37 * 8);
            uVar42 = unaff_RBP - 1 & unaff_RBP;
            if (uVar42 != 0) {
              pNVar44->ptr = sVar50;
              lVar37 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              uVar51 = uVar42 - 1;
              while( true ) {
                pNVar44 = pNVar44 + 1;
                sVar50 = *(size_t *)(uVar49 + lVar37 * 8);
                uVar51 = uVar51 & uVar42;
                if (uVar51 == 0) break;
                pNVar44->ptr = sVar50;
                lVar37 = 0;
                if (uVar51 != 0) {
                  for (; (uVar51 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                  }
                }
                uVar42 = uVar51 - 1;
              }
            }
          }
        }
        else {
          iVar41 = 6;
        }
      } while (iVar41 == 0);
      if (iVar41 == 6) {
        uVar49 = (ulong)((uint)sVar50 & 0xf);
        uVar42 = uVar49 - 8;
        bVar56 = uVar49 != 8;
        if (bVar56) {
          uVar51 = sVar50 & 0xfffffffffffffff0;
          uVar49 = 0;
          do {
            lVar36 = uVar49 * 0x58;
            lVar37 = lVar36 + uVar51;
            uVar55 = *(ulong *)(uVar51 + 0x20 + lVar36);
            auVar63._8_8_ = 0;
            auVar63._0_8_ = uVar55;
            uVar4 = *(undefined8 *)(uVar51 + 0x24 + lVar36);
            bVar34 = (byte)uVar55;
            bVar73 = (byte)uVar4;
            bVar15 = (byte)(uVar55 >> 8);
            bVar80 = (byte)((ulong)uVar4 >> 8);
            bVar16 = (byte)(uVar55 >> 0x10);
            bVar81 = (byte)((ulong)uVar4 >> 0x10);
            bVar17 = (byte)(uVar55 >> 0x18);
            bVar82 = (byte)((ulong)uVar4 >> 0x18);
            bVar18 = (byte)(uVar55 >> 0x20);
            bVar83 = (byte)((ulong)uVar4 >> 0x20);
            bVar19 = (byte)(uVar55 >> 0x28);
            bVar88 = (byte)((ulong)uVar4 >> 0x28);
            bVar20 = (byte)(uVar55 >> 0x30);
            bVar89 = (byte)((ulong)uVar4 >> 0x30);
            bVar26 = (byte)((ulong)uVar4 >> 0x38);
            bVar21 = (byte)(uVar55 >> 0x38);
            auVar76[0] = -((byte)((bVar34 < bVar73) * bVar34 | (bVar34 >= bVar73) * bVar73) ==
                          bVar34);
            auVar76[1] = -((byte)((bVar15 < bVar80) * bVar15 | (bVar15 >= bVar80) * bVar80) ==
                          bVar15);
            auVar76[2] = -((byte)((bVar16 < bVar81) * bVar16 | (bVar16 >= bVar81) * bVar81) ==
                          bVar16);
            auVar76[3] = -((byte)((bVar17 < bVar82) * bVar17 | (bVar17 >= bVar82) * bVar82) ==
                          bVar17);
            auVar76[4] = -((byte)((bVar18 < bVar83) * bVar18 | (bVar18 >= bVar83) * bVar83) ==
                          bVar18);
            auVar76[5] = -((byte)((bVar19 < bVar88) * bVar19 | (bVar19 >= bVar88) * bVar88) ==
                          bVar19);
            auVar76[6] = -((byte)((bVar20 < bVar89) * bVar20 | (bVar20 >= bVar89) * bVar89) ==
                          bVar20);
            auVar76[7] = -((byte)((bVar21 < bVar26) * bVar21 | (bVar21 >= bVar26) * bVar26) ==
                          bVar21);
            auVar76[8] = 0xff;
            auVar76[9] = 0xff;
            auVar76[10] = 0xff;
            auVar76[0xb] = 0xff;
            auVar76[0xc] = 0xff;
            auVar76[0xd] = 0xff;
            auVar76[0xe] = 0xff;
            auVar76[0xf] = 0xff;
            auVar99._8_4_ = 0xffffffff;
            auVar99._0_8_ = 0xffffffffffffffff;
            auVar99._12_4_ = 0xffffffff;
            auVar62 = pmovzxbd(auVar63,auVar76 ^ auVar99);
            auVar62 = auVar62 ^ auVar99;
            auVar101._0_4_ = auVar62._0_4_ << 0x1f;
            auVar101._4_4_ = auVar62._4_4_ << 0x1f;
            auVar101._8_4_ = auVar62._8_4_ << 0x1f;
            auVar101._12_4_ = auVar62._12_4_ << 0x1f;
            uVar32 = movmskps((int)uVar49,auVar101);
            fVar60 = *(float *)(uVar51 + 0x38 + lVar36);
            fVar66 = *(float *)(uVar51 + 0x3c + lVar36);
            fVar69 = *(float *)(uVar51 + 0x44 + lVar36);
            auVar64._8_8_ = 0;
            auVar64._0_8_ = *(ulong *)((ulong)(((uint)(fVar157 < 0.0) << 4) >> 2) + 0x20 + lVar37);
            auVar62 = pmovzxbd(auVar64,auVar64);
            auVar65._8_8_ = 0;
            auVar65._0_8_ = *(ulong *)((uVar38 >> 2) + 0x20 + lVar37);
            auVar98 = pmovzxbd(auVar65,auVar65);
            fVar71 = *(float *)(uVar51 + 0x48 + lVar36);
            auVar77._8_8_ = 0;
            auVar77._0_8_ = *(ulong *)((uVar47 >> 2) + 0x20 + lVar37);
            auVar63 = pmovzxbd(auVar77,auVar77);
            auVar100._8_8_ = 0;
            auVar100._0_8_ = *(ulong *)(((uVar47 ^ 0x10) >> 2) + 0x20 + lVar37);
            auVar101 = pmovzxbd(auVar100,auVar100);
            fVar74 = *(float *)(uVar51 + 0x4c + lVar36);
            auVar122._8_8_ = 0;
            auVar122._0_8_ = *(ulong *)((uVar48 >> 2) + 0x20 + lVar37);
            auVar64 = pmovzxbd(auVar122,auVar122);
            auVar129._8_8_ = 0;
            auVar129._0_8_ = *(ulong *)(((uVar48 ^ 0x10) >> 2) + 0x20 + lVar37);
            auVar65 = pmovzxbd(auVar129,auVar129);
            fVar84 = *(float *)(uVar51 + 0x40 + lVar36);
            fVar114 = (((float)auVar62._0_4_ * fVar69 + fVar60) - fVar27) * fVar157;
            fVar117 = (((float)auVar62._4_4_ * fVar69 + fVar60) - fVar27) * fVar157;
            fVar116 = (((float)auVar62._8_4_ * fVar69 + fVar60) - fVar27) * fVar157;
            fVar119 = (((float)auVar62._12_4_ * fVar69 + fVar60) - fVar27) * fVar157;
            fVar90 = (((float)auVar63._0_4_ * fVar71 + fVar66) - fVar28) * fVar158;
            fVar93 = (((float)auVar63._4_4_ * fVar71 + fVar66) - fVar28) * fVar158;
            fVar110 = (((float)auVar63._8_4_ * fVar71 + fVar66) - fVar28) * fVar158;
            fVar112 = (((float)auVar63._12_4_ * fVar71 + fVar66) - fVar28) * fVar158;
            uVar61 = (uint)((int)fVar90 < (int)fVar114) * (int)fVar114 |
                     (uint)((int)fVar90 >= (int)fVar114) * (int)fVar90;
            uVar67 = (uint)((int)fVar93 < (int)fVar117) * (int)fVar117 |
                     (uint)((int)fVar93 >= (int)fVar117) * (int)fVar93;
            uVar70 = (uint)((int)fVar110 < (int)fVar116) * (int)fVar116 |
                     (uint)((int)fVar110 >= (int)fVar116) * (int)fVar110;
            uVar72 = (uint)((int)fVar112 < (int)fVar119) * (int)fVar119 |
                     (uint)((int)fVar112 >= (int)fVar119) * (int)fVar112;
            fVar90 = (((float)auVar98._0_4_ * fVar69 + fVar60) - fVar27) * fVar157;
            fVar93 = (((float)auVar98._4_4_ * fVar69 + fVar60) - fVar27) * fVar157;
            fVar110 = (((float)auVar98._8_4_ * fVar69 + fVar60) - fVar27) * fVar157;
            fVar60 = (((float)auVar98._12_4_ * fVar69 + fVar60) - fVar27) * fVar157;
            fVar69 = (((float)auVar101._0_4_ * fVar71 + fVar66) - fVar28) * fVar158;
            fVar112 = (((float)auVar101._4_4_ * fVar71 + fVar66) - fVar28) * fVar158;
            fVar114 = (((float)auVar101._8_4_ * fVar71 + fVar66) - fVar28) * fVar158;
            fVar66 = (((float)auVar101._12_4_ * fVar71 + fVar66) - fVar28) * fVar158;
            uVar75 = (uint)((int)fVar90 < (int)fVar69) * (int)fVar90 |
                     (uint)((int)fVar90 >= (int)fVar69) * (int)fVar69;
            uVar85 = (uint)((int)fVar93 < (int)fVar112) * (int)fVar93 |
                     (uint)((int)fVar93 >= (int)fVar112) * (int)fVar112;
            uVar91 = (uint)((int)fVar110 < (int)fVar114) * (int)fVar110 |
                     (uint)((int)fVar110 >= (int)fVar114) * (int)fVar114;
            uVar94 = (uint)((int)fVar60 < (int)fVar66) * (int)fVar60 |
                     (uint)((int)fVar60 >= (int)fVar66) * (int)fVar66;
            fVar60 = (((float)auVar64._0_4_ * fVar74 + fVar84) - fVar29) * fVar160;
            fVar66 = (((float)auVar64._4_4_ * fVar74 + fVar84) - fVar29) * fVar160;
            fVar69 = (((float)auVar64._8_4_ * fVar74 + fVar84) - fVar29) * fVar160;
            fVar71 = (((float)auVar64._12_4_ * fVar74 + fVar84) - fVar29) * fVar160;
            uVar96 = (uint)((int)fVar60 < (int)fVar152) * (int)fVar152 |
                     (uint)((int)fVar60 >= (int)fVar152) * (int)fVar60;
            uVar104 = (uint)((int)fVar66 < (int)fVar152) * (int)fVar152 |
                      (uint)((int)fVar66 >= (int)fVar152) * (int)fVar66;
            uVar106 = (uint)((int)fVar69 < (int)fVar152) * (int)fVar152 |
                      (uint)((int)fVar69 >= (int)fVar152) * (int)fVar69;
            uVar108 = (uint)((int)fVar71 < (int)fVar152) * (int)fVar152 |
                      (uint)((int)fVar71 >= (int)fVar152) * (int)fVar71;
            fVar60 = (((float)auVar65._0_4_ * fVar74 + fVar84) - fVar29) * fVar160;
            fVar66 = (((float)auVar65._4_4_ * fVar74 + fVar84) - fVar29) * fVar160;
            fVar69 = (((float)auVar65._8_4_ * fVar74 + fVar84) - fVar29) * fVar160;
            fVar71 = (((float)auVar65._12_4_ * fVar74 + fVar84) - fVar29) * fVar160;
            uVar111 = (uint)((int)fVar3 < (int)fVar60) * (int)fVar3 |
                      (uint)((int)fVar3 >= (int)fVar60) * (int)fVar60;
            uVar113 = (uint)((int)fVar3 < (int)fVar66) * (int)fVar3 |
                      (uint)((int)fVar3 >= (int)fVar66) * (int)fVar66;
            uVar115 = (uint)((int)fVar3 < (int)fVar69) * (int)fVar3 |
                      (uint)((int)fVar3 >= (int)fVar69) * (int)fVar69;
            uVar118 = (uint)((int)fVar3 < (int)fVar71) * (int)fVar3 |
                      (uint)((int)fVar3 >= (int)fVar71) * (int)fVar71;
            auVar123._0_4_ =
                 -(uint)((int)(((int)uVar75 < (int)uVar111) * uVar75 |
                              ((int)uVar75 >= (int)uVar111) * uVar111) <
                        (int)(((int)uVar96 < (int)uVar61) * uVar61 |
                             ((int)uVar96 >= (int)uVar61) * uVar96));
            auVar123._4_4_ =
                 -(uint)((int)(((int)uVar85 < (int)uVar113) * uVar85 |
                              ((int)uVar85 >= (int)uVar113) * uVar113) <
                        (int)(((int)uVar104 < (int)uVar67) * uVar67 |
                             ((int)uVar104 >= (int)uVar67) * uVar104));
            auVar123._8_4_ =
                 -(uint)((int)(((int)uVar91 < (int)uVar115) * uVar91 |
                              ((int)uVar91 >= (int)uVar115) * uVar115) <
                        (int)(((int)uVar106 < (int)uVar70) * uVar70 |
                             ((int)uVar106 >= (int)uVar70) * uVar106));
            auVar123._12_4_ =
                 -(uint)((int)(((int)uVar94 < (int)uVar118) * uVar94 |
                              ((int)uVar94 >= (int)uVar118) * uVar118) <
                        (int)(((int)uVar108 < (int)uVar72) * uVar72 |
                             ((int)uVar108 >= (int)uVar72) * uVar108));
            uVar35 = movmskps((int)lVar36,auVar123);
            bVar34 = ~(byte)uVar35 & (byte)uVar32;
            if (bVar34 != 0) {
              uVar55 = (ulong)bVar34;
              do {
                lVar36 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
                  }
                }
                uVar6 = *(ushort *)(lVar37 + lVar36 * 8);
                uVar7 = *(ushort *)(lVar37 + 2 + lVar36 * 8);
                local_b20 = (ulong)*(uint *)(lVar37 + 0x50);
                uVar61 = *(uint *)(lVar37 + 4 + lVar36 * 8);
                pSVar8 = local_b28->scene;
                pGVar9 = (pSVar8->geometries).items[local_b20].ptr;
                lVar10 = *(long *)&pGVar9->field_0x58;
                p_Var33 = *(RTCFilterFunctionN *)&pGVar9[1].time_range.upper;
                lVar52 = (ulong)uVar61 *
                         pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                ;
                uVar70 = uVar6 & 0x7fff;
                uVar72 = uVar7 & 0x7fff;
                uVar67 = *(uint *)(lVar10 + 4 + lVar52);
                pRVar53 = (RTCIntersectArguments *)(ulong)uVar67;
                uVar54 = (ulong)(uVar67 * uVar72 + *(int *)(lVar10 + lVar52) + uVar70);
                p_Var11 = pGVar9[1].intersectionFilterN;
                pfVar2 = (float *)(p_Var33 + (long)p_Var11 * uVar54);
                fVar60 = *pfVar2;
                fVar66 = pfVar2[1];
                fVar69 = pfVar2[2];
                pfVar2 = (float *)(p_Var33 + (uVar54 + 1) * (long)p_Var11);
                local_b18._0_4_ = *pfVar2;
                fVar71 = pfVar2[1];
                fVar74 = pfVar2[2];
                lVar36 = (long)&pRVar53->flags + uVar54;
                pfVar2 = (float *)(p_Var33 + lVar36 * (long)p_Var11);
                fVar84 = *pfVar2;
                fVar90 = pfVar2[1];
                fVar93 = pfVar2[2];
                lVar39 = (long)&pRVar53->flags + uVar54 + 1;
                pfVar2 = (float *)(p_Var33 + lVar39 * (long)p_Var11);
                fVar110 = *pfVar2;
                fVar112 = pfVar2[1];
                fVar114 = pfVar2[2];
                uVar40 = (ulong)(-1 < (short)uVar6);
                pfVar1 = (float *)(p_Var33 + (uVar54 + uVar40 + 1) * (long)p_Var11);
                local_b18._4_4_ = *pfVar1;
                fVar117 = pfVar1[1];
                fVar116 = pfVar1[2];
                lVar43 = lVar39 + uVar40;
                pRVar45 = (RTCIntersectArguments *)0x0;
                if (-1 < (short)uVar7) {
                  pRVar45 = pRVar53;
                }
                pfVar1 = (float *)(p_Var33 + lVar43 * (long)p_Var11);
                fVar119 = *pfVar1;
                fVar131 = pfVar1[1];
                fVar135 = pfVar1[2];
                pfVar1 = (float *)(p_Var33 + ((long)&pRVar45->flags + lVar36) * (long)p_Var11);
                fVar87 = *pfVar1;
                fVar95 = pfVar1[1];
                fVar151 = pfVar1[2];
                lVar36 = ((long)&pRVar45->flags + lVar39) * (long)p_Var11;
                pfVar1 = (float *)(p_Var33 + lVar36);
                fVar137 = *pfVar1;
                fVar132 = pfVar1[1];
                fVar139 = pfVar1[2];
                fStack_b10 = fVar119;
                fStack_b0c = fVar110;
                local_b08 = fVar110;
                fStack_b04 = fVar112;
                fStack_b00 = fVar114;
                fStack_afc = pfVar2[3];
                fVar147 = fVar66 - fVar71;
                fVar148 = fVar71 - fVar117;
                fVar149 = fVar112 - fVar131;
                fVar150 = fVar90 - fVar112;
                fVar163 = fVar69 - fVar74;
                fVar165 = fVar74 - fVar116;
                fVar167 = fVar114 - fVar135;
                fVar169 = fVar93 - fVar114;
                fVar133 = fVar90 - fVar66;
                fVar134 = fVar112 - fVar71;
                fVar136 = fVar132 - fVar112;
                fVar138 = fVar95 - fVar90;
                fVar140 = fVar93 - fVar69;
                fVar144 = fVar114 - fVar74;
                fVar145 = fVar139 - fVar114;
                fVar146 = fVar151 - fVar93;
                hit.vNg.field_0._0_4_ = fVar163 * fVar133 - fVar147 * fVar140;
                hit.vNg.field_0._4_4_ = fVar165 * fVar134 - fVar148 * fVar144;
                hit.vNg.field_0._8_4_ = fVar167 * fVar136 - fVar149 * fVar145;
                hit.vNg.field_0._12_4_ = fVar169 * fVar138 - fVar150 * fVar146;
                fVar120 = fVar84 - fVar60;
                fVar126 = fVar110 - (float)local_b18;
                fVar127 = fVar137 - fVar110;
                fVar128 = fVar87 - fVar84;
                fVar109 = (local_b30->org).field_0.m128[0];
                fVar156 = (local_b30->org).field_0.m128[1];
                fStack_b3c = (local_b30->org).field_0.m128[2];
                fVar97 = fVar60 - fVar109;
                fVar105 = (float)local_b18 - fVar109;
                fVar107 = fVar110 - fVar109;
                fVar109 = fVar84 - fVar109;
                fVar66 = fVar66 - fVar156;
                fVar86 = fVar71 - fVar156;
                fVar92 = fVar112 - fVar156;
                fVar90 = fVar90 - fVar156;
                fVar156 = (local_b30->dir).field_0.m128[0];
                fVar141 = (local_b30->dir).field_0.m128[1];
                fVar121 = (local_b30->dir).field_0.m128[2];
                fVar175 = fVar97 * fVar141 - fVar66 * fVar156;
                fVar176 = fVar105 * fVar141 - fVar86 * fVar156;
                fVar177 = fVar107 * fVar141 - fVar92 * fVar156;
                fVar178 = fVar109 * fVar141 - fVar90 * fVar156;
                fVar60 = fVar60 - (float)local_b18;
                fVar159 = (float)local_b18 - local_b18._4_4_;
                fVar161 = fVar110 - fVar119;
                fVar162 = fVar84 - fVar110;
                hit.vNg.field_0._16_4_ = fVar60 * fVar140 - fVar163 * fVar120;
                hit.vNg.field_0._20_4_ = fVar159 * fVar144 - fVar165 * fVar126;
                hit.vNg.field_0._24_4_ = fVar161 * fVar145 - fVar167 * fVar127;
                hit.vNg.field_0._28_4_ = fVar162 * fVar146 - fVar169 * fVar128;
                fVar69 = fVar69 - fStack_b3c;
                fVar68 = fVar74 - fStack_b3c;
                fStack_b40 = fVar114 - fStack_b3c;
                fStack_b3c = fVar93 - fStack_b3c;
                fVar171 = fVar69 * fVar156 - fVar97 * fVar121;
                fVar172 = fVar68 * fVar156 - fVar105 * fVar121;
                fVar173 = fStack_b40 * fVar156 - fVar107 * fVar121;
                fVar174 = fStack_b3c * fVar156 - fVar109 * fVar121;
                hit.vNg.field_0._32_4_ = fVar147 * fVar120 - fVar60 * fVar133;
                hit.vNg.field_0._36_4_ = fVar148 * fVar126 - fVar159 * fVar134;
                hit.vNg.field_0._40_4_ = fVar149 * fVar127 - fVar161 * fVar136;
                hit.vNg.field_0._44_4_ = fVar150 * fVar128 - fVar162 * fVar138;
                local_b48 = (RTCFilterFunctionN)CONCAT44(fVar68,fVar69);
                fVar164 = fVar66 * fVar121 - fVar69 * fVar141;
                fVar166 = fVar86 * fVar121 - fVar68 * fVar141;
                fVar168 = fVar92 * fVar121 - fStack_b40 * fVar141;
                fVar170 = fVar90 * fVar121 - fStack_b3c * fVar141;
                fVar153 = fVar156 * (float)hit.vNg.field_0._0_4_ +
                          fVar141 * (float)hit.vNg.field_0._16_4_ +
                          fVar121 * (float)hit.vNg.field_0._32_4_;
                fVar154 = fVar156 * (float)hit.vNg.field_0._4_4_ +
                          fVar141 * (float)hit.vNg.field_0._20_4_ +
                          fVar121 * (float)hit.vNg.field_0._36_4_;
                fVar155 = fVar156 * (float)hit.vNg.field_0._8_4_ +
                          fVar141 * (float)hit.vNg.field_0._24_4_ +
                          fVar121 * (float)hit.vNg.field_0._40_4_;
                fVar156 = fVar156 * (float)hit.vNg.field_0._12_4_ +
                          fVar141 * (float)hit.vNg.field_0._28_4_ +
                          fVar121 * (float)hit.vNg.field_0._44_4_;
                local_a98 = (uint)uVar30;
                uStack_a94 = SUB84(uVar30,4);
                uStack_a90 = (uint)uVar31;
                uStack_a8c = SUB84(uVar31,4);
                uVar67 = (uint)fVar153 & 0x80000000;
                uVar75 = (uint)fVar154 & 0x80000000;
                uVar85 = (uint)fVar155 & 0x80000000;
                uVar91 = (uint)fVar156 & 0x80000000;
                fVar121 = (float)((uint)(fVar120 * fVar164 + fVar133 * fVar171 + fVar140 * fVar175)
                                 ^ uVar67);
                fVar120 = (float)((uint)(fVar126 * fVar166 + fVar134 * fVar172 + fVar144 * fVar176)
                                 ^ uVar75);
                fVar126 = (float)((uint)(fVar127 * fVar168 + fVar136 * fVar173 + fVar145 * fVar177)
                                 ^ uVar85);
                fVar127 = (float)((uint)(fVar128 * fVar170 + fVar138 * fVar174 + fVar146 * fVar178)
                                 ^ uVar91);
                fVar128 = (float)((uint)(fVar164 * fVar60 + fVar171 * fVar147 + fVar175 * fVar163) ^
                                 uVar67);
                fVar133 = (float)((uint)(fVar166 * fVar159 + fVar172 * fVar148 + fVar176 * fVar165)
                                 ^ uVar75);
                fVar134 = (float)((uint)(fVar168 * fVar161 + fVar173 * fVar149 + fVar177 * fVar167)
                                 ^ uVar85);
                fVar136 = (float)((uint)(fVar170 * fVar162 + fVar174 * fVar150 + fVar178 * fVar169)
                                 ^ uVar91);
                hit.absDen.field_0.v[0] = ABS(fVar153);
                hit.absDen.field_0.v[1] = ABS(fVar154);
                hit.absDen.field_0.v[2] = ABS(fVar155);
                hit.absDen.field_0.v[3] = ABS(fVar156);
                uVar94 = -(uint)((0.0 <= fVar128 && 0.0 <= fVar121) && fVar153 != 0.0) & local_a98 &
                         -(uint)(fVar121 + fVar128 <= hit.absDen.field_0.v[0]);
                uVar96 = -(uint)((0.0 <= fVar133 && 0.0 <= fVar120) && fVar154 != 0.0) & uStack_a94
                         & -(uint)(fVar120 + fVar133 <= hit.absDen.field_0.v[1]);
                uVar104 = -(uint)((0.0 <= fVar134 && 0.0 <= fVar126) && fVar155 != 0.0) & uStack_a90
                          & -(uint)(fVar126 + fVar134 <= hit.absDen.field_0.v[2]);
                uVar106 = -(uint)((0.0 <= fVar136 && 0.0 <= fVar127) && fVar156 != 0.0) & uStack_a8c
                          & -(uint)(fVar127 + fVar136 <= hit.absDen.field_0.v[3]);
                auVar25._4_4_ = uVar96;
                auVar25._0_4_ = uVar94;
                auVar25._8_4_ = uVar104;
                auVar25._12_4_ = uVar106;
                iVar41 = movmskps((int)lVar43,auVar25);
                pfVar2 = (float *)(p_Var33 + (lVar43 + (long)&pRVar45->flags) * (long)p_Var11);
                fVar60 = *pfVar2;
                fVar156 = pfVar2[1];
                fVar141 = pfVar2[2];
                if (iVar41 != 0) {
                  hit.T.field_0.i[0] =
                       uVar67 ^ (uint)(fVar97 * (float)hit.vNg.field_0._0_4_ +
                                      fVar66 * (float)hit.vNg.field_0._16_4_ +
                                      fVar69 * (float)hit.vNg.field_0._32_4_);
                  hit.T.field_0.i[1] =
                       uVar75 ^ (uint)(fVar105 * (float)hit.vNg.field_0._4_4_ +
                                      fVar86 * (float)hit.vNg.field_0._20_4_ +
                                      fVar68 * (float)hit.vNg.field_0._36_4_);
                  hit.T.field_0.i[2] =
                       uVar85 ^ (uint)(fVar107 * (float)hit.vNg.field_0._8_4_ +
                                      fVar92 * (float)hit.vNg.field_0._24_4_ +
                                      fStack_b40 * (float)hit.vNg.field_0._40_4_);
                  hit.T.field_0.i[3] =
                       uVar91 ^ (uint)(fVar109 * (float)hit.vNg.field_0._12_4_ +
                                      fVar90 * (float)hit.vNg.field_0._28_4_ +
                                      fStack_b3c * (float)hit.vNg.field_0._44_4_);
                  fVar66 = (local_b30->org).field_0.m128[3];
                  bVar57 = fVar66 * hit.absDen.field_0.v[1] < hit.T.field_0.v[1];
                  iVar41 = -(uint)bVar57;
                  bVar13 = fVar66 * hit.absDen.field_0.v[2] < hit.T.field_0.v[2];
                  iVar58 = -(uint)bVar13;
                  bVar14 = fVar66 * hit.absDen.field_0.v[3] < hit.T.field_0.v[3];
                  iVar59 = -(uint)bVar14;
                  auVar78._8_4_ = iVar58;
                  auVar78._4_4_ = iVar41;
                  auVar78._12_4_ = iVar59;
                  fVar69 = local_b30->tfar;
                  hit.valid.field_0._0_4_ =
                       -(uint)(hit.T.field_0.v[0] <= fVar69 * hit.absDen.field_0.v[0] &&
                              fVar66 * hit.absDen.field_0.v[0] < hit.T.field_0.v[0]) & uVar94;
                  hit.valid.field_0._4_4_ =
                       -(uint)(hit.T.field_0.v[1] <= fVar69 * hit.absDen.field_0.v[1] && bVar57) &
                       uVar96;
                  hit.valid.field_0._8_4_ =
                       -(uint)(hit.T.field_0.v[2] <= fVar69 * hit.absDen.field_0.v[2] && bVar13) &
                       uVar104;
                  hit.valid.field_0._12_4_ =
                       -(uint)(hit.T.field_0.v[3] <= fVar69 * hit.absDen.field_0.v[3] && bVar14) &
                       uVar106;
                  uVar67 = movmskps((int)p_Var33,(undefined1  [16])hit.valid.field_0);
                  p_Var33 = (RTCFilterFunctionN)(ulong)uVar67;
                  if (uVar67 != 0) {
                    auVar78._0_4_ = (float)(int)(*(ushort *)(lVar10 + 8 + lVar52) - 1);
                    auVar124._4_4_ = iVar41;
                    auVar124._0_4_ = auVar78._0_4_;
                    auVar124._8_4_ = iVar58;
                    auVar124._12_4_ = iVar59;
                    auVar62 = rcpss(auVar124,auVar78);
                    fVar66 = (2.0 - auVar78._0_4_ * auVar62._0_4_) * auVar62._0_4_;
                    auVar125._4_12_ = auVar62._4_12_;
                    auVar125._0_4_ = (float)(int)(*(ushort *)(lVar10 + 10 + lVar52) - 1);
                    auVar130._4_4_ = auVar62._4_4_;
                    auVar130._0_4_ = auVar125._0_4_;
                    auVar130._8_4_ = auVar62._8_4_;
                    auVar130._12_4_ = auVar62._12_4_;
                    auVar62 = rcpss(auVar130,auVar125);
                    fVar69 = (2.0 - auVar125._0_4_ * auVar62._0_4_) * auVar62._0_4_;
                    hit.U.field_0._0_4_ =
                         fVar66 * ((float)uVar70 * hit.absDen.field_0.v[0] + fVar121);
                    hit.U.field_0._4_4_ =
                         fVar66 * ((float)(uVar70 + 1) * hit.absDen.field_0.v[1] + fVar120);
                    hit.U.field_0._8_4_ =
                         fVar66 * ((float)(uVar70 + 1) * hit.absDen.field_0.v[2] + fVar126);
                    hit.U.field_0._12_4_ =
                         fVar66 * ((float)uVar70 * hit.absDen.field_0.v[3] + fVar127);
                    auVar102._0_4_ = (float)uVar72 * hit.absDen.field_0.v[0] + fVar128;
                    auVar102._4_4_ = (float)uVar72 * hit.absDen.field_0.v[1] + fVar133;
                    auVar102._8_4_ = (float)(uVar72 + 1) * hit.absDen.field_0.v[2] + fVar134;
                    auVar102._12_4_ = (float)(uVar72 + 1) * hit.absDen.field_0.v[3] + fVar136;
                    hit.V.field_0._0_4_ = fVar69 * auVar102._0_4_;
                    hit.V.field_0._4_4_ = fVar69 * auVar102._4_4_;
                    hit.V.field_0._8_4_ = fVar69 * auVar102._8_4_;
                    hit.V.field_0._12_4_ = fVar69 * auVar102._12_4_;
                    pGVar9 = (pSVar8->geometries).items[local_b20].ptr;
                    p_Var33 = (RTCFilterFunctionN)(ulong)(uint)local_b30->mask;
                    if ((pGVar9->mask & local_b30->mask) != 0) {
                      pRVar53 = local_b28->args;
                      if ((pRVar53->filter == (RTCFilterFunctionN)0x0) &&
                         (ray = local_b30, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00237334;
                      auVar22._4_4_ = hit.absDen.field_0.i[1];
                      auVar22._0_4_ = hit.absDen.field_0.i[0];
                      auVar22._8_4_ = hit.absDen.field_0.i[2];
                      auVar22._12_4_ = hit.absDen.field_0.i[3];
                      auVar62 = rcpps(auVar102,auVar22);
                      fVar66 = auVar62._0_4_;
                      fVar69 = auVar62._4_4_;
                      fVar90 = auVar62._8_4_;
                      fVar109 = auVar62._12_4_;
                      fVar66 = (1.0 - hit.absDen.field_0.v[0] * fVar66) * fVar66 + fVar66;
                      fVar69 = (1.0 - hit.absDen.field_0.v[1] * fVar69) * fVar69 + fVar69;
                      fVar90 = (1.0 - hit.absDen.field_0.v[2] * fVar90) * fVar90 + fVar90;
                      fVar109 = (1.0 - hit.absDen.field_0.v[3] * fVar109) * fVar109 + fVar109;
                      hit.vt.field_0.v[1] = hit.T.field_0.v[1] * fVar69;
                      hit.vt.field_0.v[0] = hit.T.field_0.v[0] * fVar66;
                      hit.vt.field_0.v[2] = hit.T.field_0.v[2] * fVar90;
                      hit.vt.field_0.v[3] = hit.T.field_0.v[3] * fVar109;
                      hit.vu.field_0.v[0] = hit.U.field_0._0_4_ * fVar66;
                      hit.vu.field_0.v[1] = hit.U.field_0._4_4_ * fVar69;
                      hit.vu.field_0.v[2] = hit.U.field_0._8_4_ * fVar90;
                      hit.vu.field_0.v[3] = hit.U.field_0._12_4_ * fVar109;
                      hit.vv.field_0.v[1] = hit.V.field_0._4_4_ * fVar69;
                      hit.vv.field_0.v[0] = hit.V.field_0._0_4_ * fVar66;
                      hit.vv.field_0.v[2] = hit.V.field_0._8_4_ * fVar90;
                      hit.vv.field_0.v[3] = hit.V.field_0._12_4_ * fVar109;
                      iVar41 = movmskps((int)lVar36,(undefined1  [16])hit.valid.field_0);
                      uVar40 = CONCAT44((int)((ulong)lVar36 >> 0x20),iVar41);
                      p_Var33 = (RTCFilterFunctionN)0x0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> (long)p_Var33 & 1) == 0; p_Var33 = p_Var33 + 1) {
                        }
                      }
                      local_b48 = p_Var33;
                      bVar57 = iVar41 == 0;
                      if (!bVar57) {
                        pRVar12 = local_b28->user;
                        do {
                          h.u = hit.vu.field_0.v[(long)local_b48];
                          h.v = hit.vv.field_0.v[(long)local_b48];
                          fVar66 = local_b30->tfar;
                          local_b30->tfar = hit.vt.field_0.v[(long)local_b48];
                          h.Ng.field_0.field_0.x =
                               *(float *)((long)&hit.vNg.field_0 + (long)local_b48 * 4);
                          h.Ng.field_0.field_0.y =
                               *(float *)((long)&hit.vNg.field_0 + (long)local_b48 * 4 + 0x10);
                          h.Ng.field_0.field_0.z =
                               *(float *)((long)&hit.vNg.field_0 + (long)local_b48 * 4 + 0x20);
                          h.primID = uVar61;
                          h.geomID = (uint)local_b20;
                          h.instID[0] = pRVar12->instID[0];
                          h.instPrimID[0] = pRVar12->instPrimID[0];
                          local_b4c = -1;
                          args.valid = &local_b4c;
                          args.geometryUserPtr = pGVar9->userPtr;
                          args.context = pRVar12;
                          args.ray = (RTCRayN *)local_b30;
                          args.hit = (RTCHitN *)&h;
                          args.N = 1;
                          if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                             ((*pGVar9->occlusionFilterN)(&args), *args.valid != 0)) {
                            p_Var33 = pRVar53->filter;
                            if (p_Var33 != (RTCFilterFunctionN)0x0) {
                              if (((pRVar53->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var33)(&args);
                              }
                              p_Var33 = (RTCFilterFunctionN)args.valid;
                              if (*args.valid == 0) goto LAB_00236eae;
                            }
                            ray = local_b30;
                            if (!bVar57) goto LAB_00237334;
                            break;
                          }
LAB_00236eae:
                          local_b30->tfar = fVar66;
                          uVar40 = uVar40 ^ 1L << ((ulong)local_b48 & 0x3f);
                          p_Var33 = (RTCFilterFunctionN)0x0;
                          if (uVar40 != 0) {
                            for (; (uVar40 >> (long)p_Var33 & 1) == 0; p_Var33 = p_Var33 + 1) {
                            }
                          }
                          local_b48 = p_Var33;
                          bVar57 = uVar40 == 0;
                        } while (!bVar57);
                      }
                    }
                  }
                }
                local_b48._0_4_ = local_b08 - fVar84;
                local_b48._4_4_ = fVar119 - fVar110;
                fStack_b40 = fVar60 - fStack_820;
                fStack_b3c = fVar137 - fStack_81c;
                fVar110 = fStack_b04 - fVar137;
                fVar87 = fVar131 - fVar87;
                fVar68 = fVar156 - fVar132;
                fVar95 = fVar132 - fVar95;
                fVar93 = fStack_b00 - fVar93;
                fVar127 = fVar135 - fVar114;
                fVar128 = fVar141 - fVar139;
                fVar151 = fVar139 - fVar151;
                fVar147 = (float)local_b18 - local_b08;
                fVar148 = local_b18._4_4_ - fVar119;
                fVar149 = fStack_b10 - fVar60;
                fVar150 = fStack_b0c - fVar137;
                fVar71 = fVar71 - fStack_b04;
                fVar117 = fVar117 - fVar131;
                fVar97 = fVar131 - fVar156;
                fVar112 = fVar112 - fVar132;
                fVar74 = fVar74 - fStack_b00;
                fVar116 = fVar116 - fVar135;
                fVar153 = fVar135 - fVar141;
                fVar114 = fVar114 - fVar139;
                fVar109 = fVar71 * fVar93 - fVar74 * fVar110;
                fVar121 = fVar117 * fVar127 - fVar116 * fVar87;
                hit.vNg.field_0._4_4_ = fVar121;
                hit.vNg.field_0._0_4_ = fVar109;
                fVar86 = fVar97 * fVar128 - fVar153 * fVar68;
                fVar92 = fVar112 * fVar151 - fVar114 * fVar95;
                hit.vNg.field_0._16_4_ = fVar74 * (float)local_b48 - fVar147 * fVar93;
                hit.vNg.field_0._20_4_ = fVar116 * local_b48._4_4_ - fVar148 * fVar127;
                hit.vNg.field_0._24_4_ = fVar153 * fStack_b40 - fVar149 * fVar128;
                hit.vNg.field_0._28_4_ = fVar114 * fStack_b3c - fVar150 * fVar151;
                hit.vNg.field_0._32_4_ = fVar147 * fVar110 - fVar71 * (float)local_b48;
                hit.vNg.field_0._36_4_ = fVar148 * fVar87 - fVar117 * local_b48._4_4_;
                hit.vNg.field_0._40_4_ = fVar149 * fVar68 - fVar97 * fStack_b40;
                hit.vNg.field_0._44_4_ = fVar150 * fVar95 - fVar112 * fStack_b3c;
                fStack_b0c = (local_b30->org).field_0.m128[0];
                fVar66 = (local_b30->org).field_0.m128[1];
                fStack_afc = (local_b30->org).field_0.m128[2];
                fVar69 = (local_b30->dir).field_0.m128[0];
                fVar84 = (local_b30->dir).field_0.m128[1];
                fVar90 = (local_b30->dir).field_0.m128[2];
                fVar105 = local_b08 - fStack_b0c;
                fVar119 = fVar119 - fStack_b0c;
                fStack_b10 = fVar60 - fStack_b0c;
                fStack_b0c = fVar137 - fStack_b0c;
                fVar60 = fStack_b04 - fVar66;
                fVar131 = fVar131 - fVar66;
                fVar156 = fVar156 - fVar66;
                fVar132 = fVar132 - fVar66;
                local_b08 = fStack_b00 - fStack_afc;
                fStack_b04 = fVar135 - fStack_afc;
                fStack_b00 = fVar141 - fStack_afc;
                fStack_afc = fVar139 - fStack_afc;
                fVar66 = fVar60 * fVar90 - local_b08 * fVar84;
                fVar135 = fVar131 * fVar90 - fStack_b04 * fVar84;
                fVar137 = fVar156 * fVar90 - fStack_b00 * fVar84;
                fVar139 = fVar132 * fVar90 - fStack_afc * fVar84;
                fVar140 = local_b08 * fVar69 - fVar105 * fVar90;
                fVar144 = fStack_b04 * fVar69 - fVar119 * fVar90;
                fVar145 = fStack_b00 * fVar69 - fStack_b10 * fVar90;
                fVar146 = fStack_afc * fVar69 - fStack_b0c * fVar90;
                local_b18 = (RTCRayQueryContext *)CONCAT44(fVar119,fVar105);
                fVar141 = fVar105 * fVar84 - fVar60 * fVar69;
                fVar107 = fVar119 * fVar84 - fVar131 * fVar69;
                fVar120 = fStack_b10 * fVar84 - fVar156 * fVar69;
                fVar126 = fStack_b0c * fVar84 - fVar132 * fVar69;
                fVar133 = fVar69 * fVar109 +
                          fVar84 * (float)hit.vNg.field_0._16_4_ +
                          fVar90 * (float)hit.vNg.field_0._32_4_;
                fVar134 = fVar69 * fVar121 +
                          fVar84 * (float)hit.vNg.field_0._20_4_ +
                          fVar90 * (float)hit.vNg.field_0._36_4_;
                fVar136 = fVar69 * fVar86 +
                          fVar84 * (float)hit.vNg.field_0._24_4_ +
                          fVar90 * (float)hit.vNg.field_0._40_4_;
                fVar138 = fVar69 * fVar92 +
                          fVar84 * (float)hit.vNg.field_0._28_4_ +
                          fVar90 * (float)hit.vNg.field_0._44_4_;
                uVar94 = (uint)fVar133 & 0x80000000;
                uVar96 = (uint)fVar134 & 0x80000000;
                uVar104 = (uint)fVar136 & 0x80000000;
                uVar106 = (uint)fVar138 & 0x80000000;
                fVar147 = (float)((uint)(fVar147 * fVar66 + fVar71 * fVar140 + fVar74 * fVar141) ^
                                 uVar94);
                fVar117 = (float)((uint)(fVar148 * fVar135 + fVar117 * fVar144 + fVar116 * fVar107)
                                 ^ uVar96);
                fVar116 = (float)((uint)(fVar149 * fVar137 + fVar97 * fVar145 + fVar153 * fVar120) ^
                                 uVar104);
                fVar112 = (float)((uint)(fVar150 * fVar139 + fVar112 * fVar146 + fVar114 * fVar126)
                                 ^ uVar106);
                fVar71 = (float)((uint)(fVar66 * (float)local_b48 +
                                       fVar140 * fVar110 + fVar141 * fVar93) ^ uVar94);
                fVar74 = (float)((uint)(fVar135 * local_b48._4_4_ +
                                       fVar144 * fVar87 + fVar107 * fVar127) ^ uVar96);
                fVar84 = (float)((uint)(fVar137 * fStack_b40 + fVar145 * fVar68 + fVar120 * fVar128)
                                ^ uVar104);
                fVar90 = (float)((uint)(fVar139 * fStack_b3c + fVar146 * fVar95 + fVar126 * fVar151)
                                ^ uVar106);
                fVar66 = ABS(fVar133);
                fVar69 = ABS(fVar134);
                hit.absDen.field_0._0_8_ = CONCAT44(fVar134,fVar133) & 0x7fffffff7fffffff;
                hit.absDen.field_0.v[2] = ABS(fVar136);
                hit.absDen.field_0.v[3] = ABS(fVar138);
                uVar67 = -(uint)((0.0 <= fVar71 && 0.0 <= fVar147) && fVar133 != 0.0) & local_a98 &
                         -(uint)(fVar147 + fVar71 <= fVar66);
                uVar75 = -(uint)((0.0 <= fVar74 && 0.0 <= fVar117) && fVar134 != 0.0) & uStack_a94 &
                         -(uint)(fVar117 + fVar74 <= fVar69);
                uVar85 = -(uint)((0.0 <= fVar84 && 0.0 <= fVar116) && fVar136 != 0.0) & uStack_a90 &
                         -(uint)(fVar116 + fVar84 <= hit.absDen.field_0.v[2]);
                uVar91 = -(uint)((0.0 <= fVar90 && 0.0 <= fVar112) && fVar138 != 0.0) & uStack_a8c &
                         -(uint)(fVar112 + fVar90 <= hit.absDen.field_0.v[3]);
                auVar23._4_4_ = uVar75;
                auVar23._0_4_ = uVar67;
                auVar23._8_4_ = uVar85;
                auVar23._12_4_ = uVar91;
                iVar41 = movmskps((int)p_Var33,auVar23);
                if (iVar41 != 0) {
                  hit.T.field_0.i[0] =
                       uVar94 ^ (uint)(fVar105 * fVar109 +
                                      fVar60 * (float)hit.vNg.field_0._16_4_ +
                                      local_b08 * (float)hit.vNg.field_0._32_4_);
                  hit.T.field_0.i[1] =
                       uVar96 ^ (uint)(fVar119 * fVar121 +
                                      fVar131 * (float)hit.vNg.field_0._20_4_ +
                                      fStack_b04 * (float)hit.vNg.field_0._36_4_);
                  hit.T.field_0.i[2] =
                       uVar104 ^ (uint)(fStack_b10 * fVar86 +
                                       fVar156 * (float)hit.vNg.field_0._24_4_ +
                                       fStack_b00 * (float)hit.vNg.field_0._40_4_);
                  hit.T.field_0.i[3] =
                       uVar106 ^ (uint)(fStack_b0c * fVar92 +
                                       fVar132 * (float)hit.vNg.field_0._28_4_ +
                                       fStack_afc * (float)hit.vNg.field_0._44_4_);
                  fVar60 = (local_b30->org).field_0.m128[3];
                  fVar93 = local_b30->tfar;
                  hit.valid.field_0._0_4_ =
                       -(uint)(hit.T.field_0.v[0] <= fVar93 * fVar66 &&
                              fVar60 * fVar66 < hit.T.field_0.v[0]) & uVar67;
                  hit.valid.field_0._4_4_ =
                       -(uint)(hit.T.field_0.v[1] <= fVar93 * fVar69 &&
                              fVar60 * fVar69 < hit.T.field_0.v[1]) & uVar75;
                  hit.valid.field_0._8_4_ =
                       -(uint)(hit.T.field_0.v[2] <= fVar93 * hit.absDen.field_0.v[2] &&
                              fVar60 * hit.absDen.field_0.v[2] < hit.T.field_0.v[2]) & uVar85;
                  hit.valid.field_0._12_4_ =
                       -(uint)(hit.T.field_0.v[3] <= fVar93 * hit.absDen.field_0.v[3] &&
                              fVar60 * hit.absDen.field_0.v[3] < hit.T.field_0.v[3]) & uVar91;
                  iVar41 = movmskps(iVar41,(undefined1  [16])hit.valid.field_0);
                  if (iVar41 != 0) {
                    hit.vNg.field_0._8_4_ = fVar86;
                    hit.vNg.field_0._12_4_ = fVar92;
                    auVar103._0_4_ = fVar66 - fVar71;
                    auVar103._4_4_ = fVar69 - fVar74;
                    auVar103._8_4_ = hit.absDen.field_0.v[2] - fVar84;
                    auVar103._12_4_ = hit.absDen.field_0.v[3] - fVar90;
                    auVar79._4_12_ = hit.valid.field_0._4_12_;
                    auVar79._0_4_ = (float)(int)(*(ushort *)(lVar10 + 8 + lVar52) - 1);
                    auVar142._4_4_ = hit.valid.field_0._4_4_;
                    auVar142._0_4_ = auVar79._0_4_;
                    auVar142._8_4_ = hit.valid.field_0._8_4_;
                    auVar142._12_4_ = hit.valid.field_0._12_4_;
                    auVar62 = rcpss(auVar142,auVar79);
                    fVar71 = (float)(int)(*(ushort *)(lVar10 + 10 + lVar52) - 1);
                    fVar60 = (2.0 - auVar79._0_4_ * auVar62._0_4_) * auVar62._0_4_;
                    auVar143._4_4_ = uVar75;
                    auVar143._0_4_ = fVar71;
                    auVar143._8_4_ = uVar85;
                    auVar143._12_4_ = uVar91;
                    auVar24._4_4_ = uVar75;
                    auVar24._0_4_ = fVar71;
                    auVar24._8_4_ = uVar85;
                    auVar24._12_4_ = uVar91;
                    auVar62 = rcpss(auVar143,auVar24);
                    fVar71 = (2.0 - fVar71 * auVar62._0_4_) * auVar62._0_4_;
                    hit.U.field_0._0_4_ = fVar60 * ((float)uVar70 * fVar66 + (fVar66 - fVar147));
                    hit.U.field_0._4_4_ =
                         fVar60 * ((float)(uVar70 + 1) * fVar69 + (fVar69 - fVar117));
                    hit.U.field_0._8_4_ =
                         fVar60 * ((float)(uVar70 + 1) * hit.absDen.field_0.v[2] +
                                  (hit.absDen.field_0.v[2] - fVar116));
                    hit.U.field_0._12_4_ =
                         fVar60 * ((float)uVar70 * hit.absDen.field_0.v[3] +
                                  (hit.absDen.field_0.v[3] - fVar112));
                    hit.V.field_0._0_4_ = fVar71 * ((float)uVar72 * fVar66 + auVar103._0_4_);
                    hit.V.field_0._4_4_ = fVar71 * ((float)uVar72 * fVar69 + auVar103._4_4_);
                    hit.V.field_0._8_4_ =
                         fVar71 * ((float)(uVar72 + 1) * hit.absDen.field_0.v[2] + auVar103._8_4_);
                    hit.V.field_0._12_4_ =
                         fVar71 * ((float)(uVar72 + 1) * hit.absDen.field_0.v[3] + auVar103._12_4_);
                    pGVar9 = (pSVar8->geometries).items[local_b20].ptr;
                    if ((pGVar9->mask & local_b30->mask) != 0) {
                      pRVar45 = local_b28->args;
                      if ((pRVar45->filter == (RTCFilterFunctionN)0x0) &&
                         (ray = local_b30, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00237334;
                      auVar62 = rcpps(auVar103,(undefined1  [16])hit.absDen.field_0);
                      fVar60 = auVar62._0_4_;
                      fVar71 = auVar62._4_4_;
                      fVar74 = auVar62._8_4_;
                      fVar84 = auVar62._12_4_;
                      fVar60 = (1.0 - fVar66 * fVar60) * fVar60 + fVar60;
                      fVar71 = (1.0 - fVar69 * fVar71) * fVar71 + fVar71;
                      fVar74 = (1.0 - hit.absDen.field_0.v[2] * fVar74) * fVar74 + fVar74;
                      fVar84 = (1.0 - hit.absDen.field_0.v[3] * fVar84) * fVar84 + fVar84;
                      hit.vt.field_0.v[0] = hit.T.field_0.v[0] * fVar60;
                      hit.vt.field_0.v[1] = hit.T.field_0.v[1] * fVar71;
                      hit.vt.field_0.v[2] = hit.T.field_0.v[2] * fVar74;
                      hit.vt.field_0.v[3] = hit.T.field_0.v[3] * fVar84;
                      hit.vu.field_0.v[0] = hit.U.field_0._0_4_ * fVar60;
                      hit.vu.field_0.v[1] = hit.U.field_0._4_4_ * fVar71;
                      hit.vu.field_0.v[2] = hit.U.field_0._8_4_ * fVar74;
                      hit.vu.field_0.v[3] = hit.U.field_0._12_4_ * fVar84;
                      hit.vv.field_0.v[0] = hit.V.field_0._0_4_ * fVar60;
                      hit.vv.field_0.v[1] = hit.V.field_0._4_4_ * fVar71;
                      hit.vv.field_0.v[2] = hit.V.field_0._8_4_ * fVar74;
                      hit.vv.field_0.v[3] = hit.V.field_0._12_4_ * fVar84;
                      iVar41 = movmskps((int)pRVar53,(undefined1  [16])hit.valid.field_0);
                      uVar54 = CONCAT44((int)((ulong)pRVar53 >> 0x20),iVar41);
                      uVar40 = 0;
                      if (uVar54 != 0) {
                        for (; (uVar54 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      local_b08._1_3_ = (undefined3)((uint)local_b08 >> 8);
                      local_b08 = (float)CONCAT31(local_b08._1_3_,iVar41 == 0);
                      if (iVar41 != 0) {
                        local_b18 = local_b28->user;
                        do {
                          h.u = hit.vu.field_0.v[uVar40];
                          h.v = hit.vv.field_0.v[uVar40];
                          local_b48._0_4_ = local_b30->tfar;
                          local_b30->tfar = hit.vt.field_0.v[uVar40];
                          h.Ng.field_0.field_0.x = *(float *)((long)&hit.vNg.field_0 + uVar40 * 4);
                          h.Ng.field_0.field_0.y =
                               *(float *)((long)&hit.vNg.field_0 + uVar40 * 4 + 0x10);
                          h.Ng.field_0.field_0.z =
                               *(float *)((long)&hit.vNg.field_0 + uVar40 * 4 + 0x20);
                          h.primID = uVar61;
                          h.geomID = (uint)local_b20;
                          h.instID[0] = local_b18->instID[0];
                          h.instPrimID[0] = local_b18->instPrimID[0];
                          local_b4c = -1;
                          args.valid = &local_b4c;
                          args.geometryUserPtr = pGVar9->userPtr;
                          args.context = local_b18;
                          args.ray = (RTCRayN *)local_b30;
                          args.hit = (RTCHitN *)&h;
                          args.N = 1;
                          if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                             ((*pGVar9->occlusionFilterN)(&args), *args.valid != 0)) {
                            if (pRVar45->filter != (RTCFilterFunctionN)0x0) {
                              if (((pRVar45->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                                (*pRVar45->filter)(&args);
                              }
                              if (*args.valid == 0) goto LAB_00237243;
                            }
                            ray = local_b30;
                            if (((uint)local_b08 & 1) == 0) goto LAB_00237334;
                            break;
                          }
LAB_00237243:
                          local_b30->tfar = (float)local_b48;
                          uVar54 = uVar54 ^ 1L << (uVar40 & 0x3f);
                          uVar40 = 0;
                          if (uVar54 != 0) {
                            for (; (uVar54 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                            }
                          }
                          local_b08 = (float)CONCAT31(local_b08._1_3_,uVar54 == 0);
                        } while (uVar54 != 0);
                      }
                    }
                  }
                }
                uVar55 = uVar55 & uVar55 - 1;
                ray = local_b30;
              } while (uVar55 != 0);
            }
            uVar49 = uVar49 + 1;
            bVar56 = uVar49 < uVar42;
          } while (uVar49 != uVar42);
        }
LAB_00237334:
        iVar41 = 0;
        if (bVar56) {
          ray->tfar = -INFINITY;
          iVar41 = 3;
        }
      }
    } while (iVar41 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }